

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chain.cpp
# Opt level: O0

void __thiscall despot::SemiChainBelief::Update(SemiChainBelief *this,ACT_TYPE action,OBS_TYPE obs)

{
  reference this_00;
  reference pvVar1;
  bool local_32;
  int status;
  int next_state;
  OBS_TYPE obs_local;
  ACT_TYPE action_local;
  SemiChainBelief *this_local;
  
  if ((action != 1) || (local_32 = true, obs != 0)) {
    local_32 = action == 0 && obs != 0;
  }
  this_00 = std::
            vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ::operator[](&this->alpha_,(long)action);
  pvVar1 = std::vector<double,_std::allocator<double>_>::operator[]
                     (this_00,(long)(int)(uint)!local_32);
  *pvVar1 = *pvVar1 + 1.0;
  this->cur_state_ = (int)obs;
  return;
}

Assistant:

void SemiChainBelief::Update(ACT_TYPE action, OBS_TYPE obs) {
	int next_state = obs;

	int status =
		((action == Chain::ACTION_B && obs == 0)
			|| (action == Chain::ACTION_A && obs != 0)) ? SUCCESS : SLIP;
	alpha_[action][status]++;

	cur_state_ = next_state;
}